

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O2

void __thiscall FGLRenderer::DrawBlend(FGLRenderer *this,sector_t *viewsector)

{
  extsector_t *peVar1;
  lightlist_t *plVar2;
  long lVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  AActor *pAVar7;
  player_t *ppVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  secplane_t *this_00;
  uint uVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float blend [4];
  DVector2 local_48;
  
  blend[0] = 0.0;
  blend[1] = 0.0;
  blend[2] = 0.0;
  blend[3] = 0.0;
  pAVar7 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
  if (pAVar7 == (AActor *)0x0) {
    ppVar8 = (player_t *)0x0;
  }
  else {
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
    ppVar8 = pAVar7->player;
  }
  if (gl_fixedcolormap != 0) goto LAB_003f81f8;
  peVar1 = viewsector->e;
  if ((peVar1->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0) {
    if ((viewsector->heightsec == (sector_t *)0x0) || ((viewsector->MoreFlags & 0x10) != 0)) {
      uVar5 = 0;
      uVar10 = 0;
      uVar11 = 0;
      goto LAB_003f8510;
    }
    lVar13 = 0x1a8;
    if (in_area != area_below) {
      lVar13 = (ulong)(in_area == area_above) * 4 + 0x1ac;
    }
    uVar5 = *(uint *)((long)&viewsector->heightsec->planes[0].xform.xOffs + lVar13);
    uVar10 = uVar5 >> 8;
    uVar11 = uVar5 >> 0x10;
    if (uVar5 < 0x1000000) goto LAB_003f8510;
LAB_003f8597:
    uVar6 = uVar5 >> 0x18;
LAB_003f859c:
    if (uVar6 == 0) goto LAB_003f81f8;
    if (uVar6 != 0xff) {
LAB_003f8633:
      V_AddBlend((float)(uVar11 & 0xff) * 0.003921569,(float)(uVar10 & 0xff) * 0.003921569,
                 (float)(uVar5 & 0xff) * 0.003921569,(float)uVar6 * 0.003921569,blend);
      goto LAB_003f81f8;
    }
  }
  else {
    lVar13 = 0x50;
    for (uVar9 = 0; uVar5 = (peVar1->XFloor).lightlist.Count, uVar9 < uVar5; uVar9 = uVar9 + 1) {
      this_00 = &viewsector->floorplane;
      if (uVar9 < uVar5 - 1) {
        this_00 = (secplane_t *)
                  ((long)&(((peVar1->XFloor).lightlist.Array)->plane).normal.X + lVar13);
      }
      local_48.Y = ViewPos.Y;
      local_48.X = ViewPos.X;
      dVar4 = secplane_t::ZatPoint(this_00,&local_48);
      if (dVar4 < ViewPos.Z) {
        plVar2 = (peVar1->XFloor).lightlist.Array;
        lVar3 = *(long *)((long)plVar2 + lVar13 + -8);
        if ((lVar3 == 0) || ((*(byte *)(lVar3 + 0x5b) & 8) == 0)) {
          uVar5 = *(uint *)((long)plVar2 + lVar13 + -0x18);
          if (uVar5 == (viewsector->ColorMap->Fade).field_0.d) {
            uVar5 = 0;
            uVar10 = 0;
            uVar11 = 0;
          }
          else {
            uVar10 = uVar5 >> 8;
            uVar11 = uVar5 >> 0x10;
            if (0xffffff < uVar5) goto LAB_003f8597;
          }
          uVar6 = 0x80;
          if ((uVar5 & 0xff) != 0 || ((uVar10 & 0xff) != 0 || (uVar11 & 0xff) != 0))
          goto LAB_003f8633;
          goto LAB_003f8510;
        }
      }
      lVar13 = lVar13 + 0x50;
    }
    uVar5 = 0;
    uVar10 = 0;
    uVar11 = 0;
LAB_003f8510:
    uVar5 = R_BlendForColormap(uVar5 & 0xff | (uVar10 & 0xff) << 8 | (uVar11 & 0xff) << 0x10);
    uVar10 = uVar5 >> 8;
    uVar11 = uVar5 >> 0x10;
    uVar6 = uVar5 >> 0x18;
    if (uVar6 != 0xff) goto LAB_003f859c;
    uVar6 = this->framebuffer->palette_brightness;
    uVar11 = uVar11 & 0xff;
    if ((int)uVar6 <= (int)uVar11) {
      uVar6 = uVar11;
    }
    uVar10 = uVar10 & 0xff;
    uVar5 = uVar5 & 0xff;
    uVar12 = uVar5;
    if (uVar5 < uVar10) {
      uVar12 = uVar10;
    }
    if (uVar12 < uVar6) {
      uVar12 = uVar6;
    }
    uVar11 = (uVar11 * 0xff) / uVar12;
    uVar10 = (uVar10 * 0xff) / uVar12;
    uVar5 = (uVar5 * 0xff) / uVar12;
  }
  fVar14 = (float)(uVar11 & 0xff) * 0.003921569;
  fVar15 = (float)(uVar10 & 0xff) * 0.003921569;
  fVar16 = (float)(uVar5 & 0xff) * 0.003921569;
  if (((fVar14 != 0.0) || (fVar15 != 0.0)) || (fVar16 != 0.0)) {
    if (gl_direct_state_change.Value == false) {
      gl_RenderState.mSrcBlend = 0x306;
      gl_RenderState.mDstBlend = 0;
    }
    else {
      (*_ptrc_glBlendFunc)(0x306,0);
    }
    gl_RenderState.mColor.vec[1] = fVar15;
    gl_RenderState.mColor.vec[0] = fVar14;
    gl_RenderState.mColor.vec[3] = 1.0;
    gl_RenderState.mColor.vec[2] = fVar16;
    gl_RenderState.mDesaturation = 0;
    gl_FillScreen();
  }
LAB_003f81f8:
  if (ppVar8 != (player_t *)0x0) {
    V_AddPlayerBlend(ppVar8,blend,0.5,0xaf);
  }
  pAVar7 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
  if (pAVar7 != (AActor *)0x0) {
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
    if (pAVar7->player == (player_t *)0x0) {
      ppVar8 = (player_t *)(&players + (long)consoleplayer * 0x54);
    }
    else {
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)(&DAT_009ba598 + (long)consoleplayer * 0x54));
      ppVar8 = pAVar7->player;
    }
    V_AddBlend(ppVar8->BlendR,ppVar8->BlendG,ppVar8->BlendB,ppVar8->BlendA,blend);
  }
  if (gl_direct_state_change.Value == false) {
    gl_RenderState.mSrcBlend = 0x302;
    gl_RenderState.mDstBlend = 0x303;
  }
  else {
    (*_ptrc_glBlendFunc)(0x302,0x303);
  }
  if (0.0 < blend[3]) {
    gl_RenderState.mColor.vec[0] = blend[0];
    gl_RenderState.mColor.vec[1] = blend[1];
    gl_RenderState.mColor.vec[2] = blend[2];
    gl_RenderState.mColor.vec[3] = blend[3];
    gl_RenderState.mDesaturation = 0;
    gl_FillScreen();
  }
  gl_RenderState.mColor.vec[0] = 1.0;
  gl_RenderState.mColor.vec[1] = 1.0;
  gl_RenderState.mColor.vec[2] = 1.0;
  gl_RenderState.mColor.vec[3] = 1.0;
  gl_RenderState.mDesaturation = 0;
  gl_RenderState.mTextureEnabled = true;
  return;
}

Assistant:

void FGLRenderer::DrawBlend(sector_t * viewsector)
{
	float blend[4]={0,0,0,0};
	PalEntry blendv=0;
	float extra_red;
	float extra_green;
	float extra_blue;
	player_t *player = NULL;

	if (players[consoleplayer].camera != NULL)
	{
		player=players[consoleplayer].camera->player;
	}

	// don't draw sector based blends when an invulnerability colormap is active
	if (!gl_fixedcolormap)
	{
		if (!viewsector->e->XFloor.ffloors.Size())
		{
			if (viewsector->heightsec && !(viewsector->MoreFlags&SECF_IGNOREHEIGHTSEC))
			{
				switch (in_area)
				{
				default:
				case area_normal: blendv = viewsector->heightsec->midmap; break;
				case area_above: blendv = viewsector->heightsec->topmap; break;
				case area_below: blendv = viewsector->heightsec->bottommap; break;
				}
			}
		}
		else
		{
			TArray<lightlist_t> & lightlist = viewsector->e->XFloor.lightlist;

			for (unsigned int i = 0; i < lightlist.Size(); i++)
			{
				double lightbottom;
				if (i < lightlist.Size() - 1)
					lightbottom = lightlist[i + 1].plane.ZatPoint(ViewPos);
				else
					lightbottom = viewsector->floorplane.ZatPoint(ViewPos);

				if (lightbottom < ViewPos.Z && (!lightlist[i].caster || !(lightlist[i].caster->flags&FF_FADEWALLS)))
				{
					// 3d floor 'fog' is rendered as a blending value
					blendv = lightlist[i].blend;
					// If this is the same as the sector's it doesn't apply!
					if (blendv == viewsector->ColorMap->Fade) blendv = 0;
					// a little hack to make this work for Legacy maps.
					if (blendv.a == 0 && blendv != 0) blendv.a = 128;
					break;
				}
			}
		}

		if (blendv.a == 0)
		{
			blendv = R_BlendForColormap(blendv);
			if (blendv.a == 255)
			{
				// The calculated average is too dark so brighten it according to the palettes's overall brightness
				int maxcol = MAX<int>(MAX<int>(framebuffer->palette_brightness, blendv.r), MAX<int>(blendv.g, blendv.b));
				blendv.r = blendv.r * 255 / maxcol;
				blendv.g = blendv.g * 255 / maxcol;
				blendv.b = blendv.b * 255 / maxcol;
			}
		}

		if (blendv.a == 255)
		{

			extra_red = blendv.r / 255.0f;
			extra_green = blendv.g / 255.0f;
			extra_blue = blendv.b / 255.0f;

			// If this is a multiplicative blend do it separately and add the additive ones on top of it.
			blendv = 0;

			// black multiplicative blends are ignored
			if (extra_red || extra_green || extra_blue)
			{
				gl_RenderState.BlendFunc(GL_DST_COLOR, GL_ZERO);
				gl_RenderState.SetColor(extra_red, extra_green, extra_blue, 1.0f);
				gl_FillScreen();
			}
		}
		else if (blendv.a)
		{
			V_AddBlend(blendv.r / 255.f, blendv.g / 255.f, blendv.b / 255.f, blendv.a / 255.0f, blend);
		}
	}

	// This mostly duplicates the code in shared_sbar.cpp
	// When I was writing this the original was called too late so that I
	// couldn't get the blend in time. However, since then I made some changes
	// here that would get lost if I switched back so I won't do it.

	if (player)
	{
		V_AddPlayerBlend(player, blend, 0.5, 175);
	}
	
	if (players[consoleplayer].camera != NULL)
	{
		// except for fadeto effects
		player_t *player = (players[consoleplayer].camera->player != NULL) ? players[consoleplayer].camera->player : &players[consoleplayer];
		V_AddBlend (player->BlendR, player->BlendG, player->BlendB, player->BlendA, blend);
	}

	gl_RenderState.BlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	if (blend[3]>0.0f)
	{
		gl_RenderState.SetColor(blend[0], blend[1], blend[2], blend[3]);
		gl_FillScreen();
	}
	gl_RenderState.ResetColor();
	gl_RenderState.EnableTexture(true);
}